

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O2

Vec_Int_t * Gia_AigerCollectLiterals(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar2;
  int iVar3;
  
  p_00 = Vec_IntAlloc(p->vCos->nSize - p->nRegs);
  iVar3 = 0;
  while ((iVar3 < p->nRegs &&
         (pGVar2 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar3), pGVar2 != (Gia_Obj_t *)0x0))) {
    iVar1 = Gia_ObjFaninLit0p(p,pGVar2);
    Vec_IntPush(p_00,iVar1);
    iVar3 = iVar3 + 1;
  }
  iVar3 = 0;
  while( true ) {
    if (p->vCos->nSize - p->nRegs <= iVar3) {
      return p_00;
    }
    pGVar2 = Gia_ManCo(p,iVar3);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFaninLit0p(p,pGVar2);
    Vec_IntPush(p_00,iVar1);
    iVar3 = iVar3 + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_AigerCollectLiterals( Gia_Man_t * p )
{
    Vec_Int_t * vLits;
    Gia_Obj_t * pObj;
    int i;
    vLits = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachRi( p, pObj, i )
        Vec_IntPush( vLits, Gia_ObjFaninLit0p(p, pObj) );
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vLits, Gia_ObjFaninLit0p(p, pObj) );
    return vLits;
}